

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O2

long duckdb::DateSubTernaryOperator::
     Operation<duckdb::string_t,duckdb::dtime_t,duckdb::dtime_t,long>
               (string_t part,dtime_t startdate,dtime_t enddate,ValidityMask *mask,idx_t idx)

{
  DatePartSpecifier DVar1;
  NotImplementedException *this;
  long lVar2;
  long lVar3;
  dtime_t enddate_00;
  dtime_t startdate_00;
  allocator local_71;
  string local_70;
  string local_50;
  string_t part_local;
  
  part_local.value.pointer.ptr = (char *)part.value._8_8_;
  part_local.value._0_8_ = part.value._0_8_;
  enddate_00.micros = (int64_t)&part_local;
  startdate_00.micros = (int64_t)&local_70;
  string_t::GetString_abi_cxx11_((string *)startdate_00.micros,(string_t *)enddate_00.micros);
  DVar1 = GetDatePartSpecifier((string *)startdate_00.micros);
  switch(DVar1) {
  case BEGIN_BIGINT:
  case ISOYEAR:
    DateSub::YearOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00);
  case MONTH:
    DateSub::MonthOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00)
    ;
  case DAY:
  case DOW:
  case ISODOW:
  case DOY:
  case JULIAN_DAY:
    DateSub::DayOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00);
  case DECADE:
    DateSub::DecadeOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case CENTURY:
    DateSub::CenturyOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case MILLENNIUM:
    DateSub::MilleniumOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  case MICROSECONDS:
    lVar3 = enddate.micros - startdate.micros;
    goto LAB_01dc07d7;
  case MILLISECONDS:
    lVar3 = enddate.micros - startdate.micros;
    lVar2 = 1000;
    break;
  case SECOND:
  case BEGIN_DOUBLE:
    lVar3 = enddate.micros - startdate.micros;
    lVar2 = 1000000;
    break;
  case MINUTE:
    lVar3 = enddate.micros - startdate.micros;
    lVar2 = 60000000;
    break;
  case HOUR:
    lVar3 = enddate.micros - startdate.micros;
    lVar2 = 3600000000;
    break;
  case WEEK:
  case YEARWEEK:
    DateSub::WeekOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>(startdate_00,enddate_00);
  case QUARTER:
    DateSub::QuarterOperator::Operation<duckdb::dtime_t,duckdb::dtime_t,long>
              (startdate_00,enddate_00);
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_50,"Specifier type not implemented for DATESUB",&local_71);
    NotImplementedException::NotImplementedException(this,&local_50);
    __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar3 = lVar3 / lVar2;
LAB_01dc07d7:
  ::std::__cxx11::string::~string((string *)&local_70);
  return lVar3;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return SubtractDateParts<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}